

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRleCompressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::RleCompressor::uncompress
          (RleCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  InputExc *this_00;
  char *pcVar4;
  char *pcVar5;
  
  if (inSize == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = rleUncompress(inSize,this->_maxScanLineSize,inPtr,this->_tmpBuffer);
    if (iVar2 == 0) {
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this_00,"Data decoding (rle) failed.");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    pcVar4 = this->_tmpBuffer;
    pcVar5 = pcVar4;
    while (pcVar3 = pcVar5 + 1, pcVar3 < pcVar4 + iVar2) {
      *pcVar3 = *pcVar3 + *pcVar5 + -0x80;
      pcVar5 = pcVar3;
    }
    pcVar4 = this->_tmpBuffer;
    pcVar5 = this->_outBuffer;
    pcVar3 = pcVar5 + iVar2;
    for (; pcVar5 < pcVar3; pcVar5 = pcVar5 + 2) {
      *pcVar5 = *pcVar4;
      if (pcVar3 <= pcVar5 + 1) break;
      pcVar1 = pcVar4 + (iVar2 + 1) / 2;
      pcVar4 = pcVar4 + 1;
      pcVar5[1] = *pcVar1;
    }
  }
  *outPtr = this->_outBuffer;
  return iVar2;
}

Assistant:

int
RleCompressor::uncompress (const char *inPtr,
			   int inSize,
			   int minY,
			   const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Decode the run-length encoded data
    //

    int outSize;

    if (0 == (outSize = rleUncompress (inSize, _maxScanLineSize,
				       (const signed char *) inPtr,
				       _tmpBuffer)))
    {
	throw IEX_NAMESPACE::InputExc ("Data decoding (rle) failed.");
    }

    //
    // Predictor.
    //

    {
	unsigned char *t = (unsigned char *) _tmpBuffer + 1;
	unsigned char *stop = (unsigned char *) _tmpBuffer + outSize;

	while (t < stop)
	{
	    int d = int (t[-1]) + int (t[0]) - 128;
	    t[0] = d;
	    ++t;
	}
    }

    //
    // Reorder the pixel data.
    //

    {
	const char *t1 = _tmpBuffer;
	const char *t2 = _tmpBuffer + (outSize + 1) / 2;
	char *s = _outBuffer;
	char *stop = s + outSize;

	while (true)
	{
	    if (s < stop)
		*(s++) = *(t1++);
	    else
		break;

	    if (s < stop)
		*(s++) = *(t2++);
	    else
		break;
	}
    }

    outPtr = _outBuffer;
    return outSize;
}